

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abeta.hpp
# Opt level: O2

double minimax::ABeta_<uttt::IBoard,uttt::Eval1>(IBoard *game,int depth,double alfa,double beta)

{
  double dVar1;
  IPlayer IVar2;
  int iVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  uint extraout_XMM0_Dd;
  double dVar7;
  undefined8 in_XMM1_Qb;
  Eval1 evaluator;
  long m;
  IBoard new_game;
  vector<long,_std::allocator<long>_> moves;
  Eval1 local_b1;
  double local_b0;
  undefined1 local_a8 [16];
  long local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  uint uStack_74;
  undefined4 uStack_70;
  uint uStack_6c;
  IBoard local_68;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  local_a8._8_4_ = in_XMM0_Dc;
  local_a8._0_8_ = alfa;
  local_a8._12_4_ = in_XMM0_Dd;
  local_88 = beta;
  if (depth == 0) {
    dVar7 = uttt::Eval1::operator()(&local_b1,game);
    uVar5 = SUB84(dVar7,0);
    uVar6 = (undefined4)((ulong)dVar7 >> 0x20);
  }
  else {
    uStack_80 = in_XMM1_Qb;
    iVar3 = uttt::IBoard::GetStatus(game);
    if (iVar3 == -1) {
      uttt::IBoard::GetPossibleMoves((vector<long,_std::allocator<long>_> *)&local_48,game);
      uStack_74 = local_88._4_4_ ^ 0x80000000;
      uStack_6c = (uint)((ulong)uStack_80 >> 0x20) ^ 0x80000000;
      uStack_70 = (undefined4)uStack_80;
      local_78 = (undefined4)local_88;
      dVar7 = 0.0;
      bVar4 = false;
      do {
        if (local_48._M_impl.super__Vector_impl_data._M_start ==
            local_48._M_impl.super__Vector_impl_data._M_finish) break;
        local_90 = *local_48._M_impl.super__Vector_impl_data._M_start;
        local_68._16_8_ = *(undefined8 *)((game->micro)._M_elems + 6);
        local_68.macro = game->macro;
        local_68.micro._M_elems[0] = (game->micro)._M_elems[0];
        local_68.micro._M_elems[1] = (game->micro)._M_elems[1];
        local_68.micro._M_elems._4_8_ = *(undefined8 *)((game->micro)._M_elems + 2);
        local_b0 = dVar7;
        uttt::IBoard::ApplyMove(&local_68,&local_90);
        dVar7 = ABeta_<uttt::IBoard,uttt::Eval1>
                          (&local_68,depth + -1,(double)CONCAT44(uStack_74,local_78),
                           -(double)local_a8._0_8_);
        dVar1 = -dVar7;
        uVar5 = SUB84(dVar7,0);
        uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
        dVar7 = dVar1;
        if ((bVar4) && (dVar1 <= local_b0)) {
          dVar7 = local_b0;
        }
        if (dVar1 <= (double)local_a8._0_8_) {
          uVar5 = local_a8._0_4_;
          uVar6 = local_a8._4_4_;
        }
        local_48._M_impl.super__Vector_impl_data._M_start =
             local_48._M_impl.super__Vector_impl_data._M_start + 1;
        bVar4 = true;
        local_a8._4_4_ = uVar6;
        local_a8._0_4_ = uVar5;
        local_a8._8_4_ = extraout_XMM0_Dc;
        local_a8._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
      } while ((double)CONCAT44(uVar6,uVar5) < local_88);
      local_b0 = dVar7;
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
      uVar5 = SUB84(local_b0,0);
      uVar6 = (undefined4)((ulong)local_b0 >> 0x20);
    }
    else {
      uVar5 = 0;
      uVar6 = 0;
      if (iVar3 != 0) {
        IVar2 = uttt::IBoard::GetPlayerToMove(game);
        if (iVar3 == IVar2) {
          uVar5 = 0xffffffff;
          uVar6 = 0x7fefffff;
        }
        else {
          uVar5 = 0xffffffff;
          uVar6 = 0xffefffff;
        }
      }
    }
  }
  return (double)CONCAT44(uVar6,uVar5);
}

Assistant:

static double
ABeta_(const IGame &game, int depth, double alfa, double beta)
{
    Eval evaluator;

    if (depth == 0)
        return evaluator(game);

    auto status = game.GetStatus();
    if (status != game::Undecided)
    {
        if (status == game::Draw)
            return 0.0;
        if (status == game.GetPlayerToMove())
            return std::numeric_limits<double>::max();
        return -std::numeric_limits<double>::max();
    }

    bool result_set = false;
    double result = 0.0;
    auto moves = game.GetPossibleMoves();
    for (auto m : moves)
    {
        IGame new_game(game);
        new_game.ApplyMove(m);
        auto r = -ABeta_<IGame, Eval>(new_game, depth - 1, -beta, -alfa);
        if (!result_set || r > result)
            result = r, result_set = true;
        alfa = std::max(alfa, r);
        if (alfa >= beta)
            break;
    }

    return result;
}